

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O0

void __thiscall ImageInput::ImageInput(ImageInput *this,string *name)

{
  uint uVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 *this_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  
  *in_RDI = &PTR__ImageInput_00433380;
  this_00 = in_RDI + 1;
  std::ifstream::ifstream(this_00);
  this_01 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(in_RDI + 0x42);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01);
  in_RDI[0x43] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x44),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x3264de);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3264ef);
  std::vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_>::vector
            ((vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_> *)0x326500);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  *(uint *)(in_RDI + 0x55) = uVar1;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  *(uint *)((long)in_RDI + 0x2ac) = uVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this_01,this_00);
  return;
}

Assistant:

ImageInput(std::string&& name) : name(name) { }